

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

Instr * Lowerer::LoadGeneratorObject(Instr *instrInsert)

{
  undefined1 *puVar1;
  Func *this;
  uint16 uVar2;
  StackSym *stackSym;
  SymOpnd *src;
  RegOpnd *dst;
  Instr *pIVar3;
  
  stackSym = StackSym::NewImplicitParamSym(3,instrInsert->m_func);
  this = instrInsert->m_func;
  uVar2 = LowererMD::GetFormalParamOffset();
  Func::SetArgOffset(this,stackSym,(uint)uVar2 << 3);
  src = IR::SymOpnd::New(&stackSym->super_Sym,TyUint64,instrInsert->m_func);
  dst = IR::RegOpnd::New(TyUint64,instrInsert->m_func);
  puVar1 = &instrInsert->m_func->field_0x240;
  *(uint *)puVar1 = *(uint *)puVar1 | 0x100;
  pIVar3 = InsertMove(&dst->super_Opnd,&src->super_Opnd,instrInsert,true);
  return pIVar3;
}

Assistant:

IR::Instr *
Lowerer::LoadGeneratorObject(IR::Instr * instrInsert)
{
    StackSym * generatorSym = StackSym::NewImplicitParamSym(3, instrInsert->m_func);
    instrInsert->m_func->SetArgOffset(generatorSym, LowererMD::GetFormalParamOffset() * MachPtr);
    IR::SymOpnd * generatorSymOpnd = IR::SymOpnd::New(generatorSym, TyMachPtr, instrInsert->m_func);
    IR::RegOpnd * generatorRegOpnd = IR::RegOpnd::New(TyMachPtr, instrInsert->m_func);
    instrInsert->m_func->SetHasImplicitParamLoad();
    return Lowerer::InsertMove(generatorRegOpnd, generatorSymOpnd, instrInsert);
}